

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicGLSLConst::Run(BasicGLSLConst *this)

{
  pointer *data;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  reference data_00;
  ivec4 *a;
  undefined8 uVar4;
  undefined8 uVar5;
  CallLogWrapper *this_00;
  Vector<int,_4> local_f0;
  string local_e0;
  Vector<int,_4> local_c0;
  string local_b0;
  Vector<int,_4> local_90;
  ivec4 *local_80;
  ivec4 *map_data;
  undefined1 local_70 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> out_data;
  GLint i;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *src_cs;
  BasicGLSLConst *this_local;
  
  local_20 = 
  "\nlayout (local_size_x = 1) in;\nlayout(std430) buffer out_data {\n  ivec4 o_color;\n};\nuniform int MaxImageUnits;\nuniform int MaxCombinedShaderOutputResources;\nuniform int MaxVertexImageUniforms;\nuniform int MaxFragmentImageUniforms;\nuniform int MaxComputeImageUniforms;\nuniform int MaxCombinedImageUniforms;\nvoid main() {\n  o_color = ivec4(0, 1, 0, 1);\n  if (gl_MaxImageUnits != MaxImageUnits) o_color = ivec4(1, 0, 0, 1);\n  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = ivec4(1, 0, 0, 2);\n  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = ivec4(1, 0, 0, 4);\n  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = ivec4(1, 0, 0, 5);\n  if (gl_MaxComputeImageUniforms != MaxComputeImageUniforms) o_color = ivec4(1, 0, 0, 6);\n  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = ivec4(1, 0, 0, 9);\n}"
  ;
  src_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout (local_size_x = 1) in;\nlayout(std430) buffer out_data {\n  ivec4 o_color;\n};\nuniform int MaxImageUnits;\nuniform int MaxCombinedShaderOutputResources;\nuniform int MaxVertexImageUniforms;\nuniform int MaxFragmentImageUniforms;\nuniform int MaxComputeImageUniforms;\nuniform int MaxCombinedImageUniforms;\nvoid main() {\n  o_color = ivec4(0, 1, 0, 1);\n  if (gl_MaxImageUnits != MaxImageUnits) o_color = ivec4(1, 0, 0, 1);\n  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = ivec4(1, 0, 0, 2);\n  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = ivec4(1, 0, 0, 4);\n  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = ivec4(1, 0, 0, 5);\n  if (gl_MaxComputeImageUniforms != MaxComputeImageUniforms) o_color = ivec4(1, 0, 0, 6);\n  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = ivec4(1, 0, 0, 9);\n}"
             ,&local_41);
  GVar2 = ShaderImageLoadStoreBase::CreateComputeProgram
                    (&this->super_ShaderImageLoadStoreBase,&local_40,false);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  data = &out_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"MaxImageUnits");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f39,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedShaderOutputResources");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ca,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxVertexImageUniforms");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ce,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxFragmentImageUniforms");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x91bd,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxComputeImageUniforms");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90cf,(GLint *)data);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,this->m_program,"MaxCombinedImageUniforms");
  glu::CallLogWrapper::glUniform1i
            (this_00,GVar3,
             (uint)out_data.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70,1,
             (allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&map_data + 7));
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_buffer);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0,this->m_buffer);
  data_00 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                      ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                       local_70,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0x10,data_00,0x88e4);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x200);
  a = (ivec4 *)glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x90d2,0,0x10,1);
  local_80 = a;
  tcu::Vector<int,_4>::Vector(&local_90,0,1,0,1);
  bVar1 = ShaderImageLoadStoreBase::Equal(&this->super_ShaderImageLoadStoreBase,a,&local_90,0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (BasicGLSLConst *)0x0;
  }
  else {
    tcu::Vector<int,_4>::Vector(&local_c0,local_80);
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              (&local_b0,(ShaderImageLoadStoreBase *)this,&local_c0);
    uVar4 = std::__cxx11::string::c_str();
    tcu::Vector<int,_4>::Vector(&local_f0,0,1,0,1);
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              (&local_e0,(ShaderImageLoadStoreBase *)this,&local_f0);
    uVar5 = std::__cxx11::string::c_str();
    anon_unknown_0::Output
              ("[%d] Value is: %s. Value should be: %s.\n",
               (ulong)(uint)out_data.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar4,uVar5);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_local = (BasicGLSLConst *)&DAT_ffffffffffffffff;
  }
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* src_cs =
			NL "layout (local_size_x = 1) in;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color;" NL "};" NL
			   "uniform int MaxImageUnits;" NL "uniform int MaxCombinedShaderOutputResources;" NL
			   "uniform int MaxVertexImageUniforms;" NL "uniform int MaxFragmentImageUniforms;" NL
			   "uniform int MaxComputeImageUniforms;" NL "uniform int MaxCombinedImageUniforms;" NL "void main() {" NL
			   "  o_color = ivec4(0, 1, 0, 1);" NL
			   "  if (gl_MaxImageUnits != MaxImageUnits) o_color = ivec4(1, 0, 0, 1);" NL
			   "  if (gl_MaxCombinedShaderOutputResources != MaxCombinedShaderOutputResources) o_color = ivec4(1, 0, "
			   "0, 2);" NL "  if (gl_MaxVertexImageUniforms != MaxVertexImageUniforms) o_color = ivec4(1, 0, 0, 4);" NL
			   "  if (gl_MaxFragmentImageUniforms != MaxFragmentImageUniforms) o_color = ivec4(1, 0, 0, 5);" NL
			   "  if (gl_MaxComputeImageUniforms != MaxComputeImageUniforms) o_color = ivec4(1, 0, 0, 6);" NL
			   "  if (gl_MaxCombinedImageUniforms != MaxCombinedImageUniforms) o_color = ivec4(1, 0, 0, 9);" NL "}";
		m_program = CreateComputeProgram(src_cs);
		glUseProgram(m_program);

		GLint i;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxImageUnits"), i);

		glGetIntegerv(GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedShaderOutputResources"), i);

		glGetIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxVertexImageUniforms"), i);

		glGetIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxFragmentImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMPUTE_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxComputeImageUniforms"), i);

		glGetIntegerv(GL_MAX_COMBINED_IMAGE_UNIFORMS, &i);
		glUniform1i(glGetUniformLocation(m_program, "MaxCombinedImageUniforms"), i);

		std::vector<ivec4> out_data(1);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		ivec4* map_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4, GL_MAP_READ_BIT);

		if (!Equal(map_data[0], ivec4(0, 1, 0, 1), 0))
		{
			Output("[%d] Value is: %s. Value should be: %s.\n", i, ToString(map_data[0]).c_str(),
				   ToString(ivec4(0, 1, 0, 1)).c_str());
			return ERROR;
		}
		return NO_ERROR;
	}